

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O0

Data * __thiscall csm::MIC::Data::operator=(Data *this,Data *argData)

{
  Type TVar1;
  int value;
  Type *pTVar2;
  double value_00;
  string local_38;
  Data *local_18;
  Data *argData_local;
  Data *this_local;
  
  local_18 = argData;
  argData_local = this;
  pTVar2 = type(argData);
  TVar1 = *pTVar2;
  if (TVar1 == STRING_TYPE) {
    strValue_abi_cxx11_(&local_38,local_18);
    setValue(this,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (TVar1 == INT_TYPE) {
    value = intValue(local_18);
    setValue(this,value,true);
  }
  else if (TVar1 == DOUBLE_TYPE) {
    value_00 = dblValue(local_18);
    setValue(this,value_00,true);
  }
  return this;
}

Assistant:

Data& Data::operator=(const Data& argData)
{
   switch(argData.type())
   {
   case STRING_TYPE  : setValue(argData.strValue()); break;
   case INT_TYPE     : setValue(argData.intValue()); break;
   case DOUBLE_TYPE  : setValue(argData.dblValue()); break;
   }
   
   return *this;
}